

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.cxx
# Opt level: O2

bool __thiscall
cmVariableRequiresCommand::InitialPass
          (cmVariableRequiresCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  cmState *this_00;
  char *pcVar6;
  ulong uVar7;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string testVariable;
  string notSet;
  string resultVariable;
  
  bVar3 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0035,
                     "The variable_requires command should not be called; see CMP0035.");
  if (bVar3) {
    return true;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string
              ((string *)&testVariable,"called with incorrect number of arguments",
               (allocator *)&resultVariable);
    cmCommand::SetError(&this->super_cmCommand,&testVariable);
    std::__cxx11::string::~string((string *)&testVariable);
    return false;
  }
  std::__cxx11::string::string((string *)&testVariable,(string *)pbVar1);
  bVar3 = cmMakefile::IsOn((this->super_cmCommand).Makefile,&testVariable);
  if (!bVar3) goto LAB_0033f5f5;
  std::__cxx11::string::string
            ((string *)&resultVariable,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1));
  notSet._M_dataplus._M_p = (pointer)&notSet.field_2;
  notSet._M_string_length = 0;
  notSet.field_2._M_local_buf[0] = '\0';
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  uVar7 = 2;
  bVar3 = true;
  bVar5 = 0;
  while( true ) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (this->super_cmCommand).Makefile;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar7)
    break;
    bVar4 = cmMakefile::IsOn(pcVar2,pbVar1 + uVar7);
    if (!bVar4) {
      std::__cxx11::string::append((string *)&notSet);
      std::__cxx11::string::append((char *)&notSet);
      pcVar6 = cmState::GetCacheEntryValue
                         (this_00,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar7);
      if (pcVar6 != (char *)0x0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&message,"ADVANCED",(allocator *)&local_b0);
        bVar3 = cmState::GetCacheEntryPropertyAsBool(this_00,pbVar1 + uVar7,&message);
        std::__cxx11::string::~string((string *)&message);
        bVar5 = bVar5 | bVar3;
      }
      bVar3 = false;
    }
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  pcVar6 = cmMakefile::GetDefinition(pcVar2,&resultVariable);
  if (pcVar6 == (char *)0x0) {
LAB_0033f4f6:
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&resultVariable,bVar3);
    if (bVar3 == false) {
LAB_0033f518:
      std::__cxx11::string::string
                ((string *)&message,"Variable assertion failed:\n",(allocator *)&local_b0);
      std::operator+(&local_b0,&testVariable,
                     " Requires that the following unset variables are set:\n");
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::append((char *)&message);
      std::operator+(&local_b0,&testVariable," to false, and re-configure.\n");
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::~string((string *)&local_b0);
      if (bVar5 != 0) {
        std::__cxx11::string::append((char *)&message);
      }
      cmSystemTools::Error(message._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&message);
    }
  }
  else if (bVar3 == false) {
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&message,pcVar6,(allocator *)&local_b0);
    bVar3 = cmMakefile::IsOn(pcVar2,&message);
    std::__cxx11::string::~string((string *)&message);
    if (bVar3) {
      bVar3 = false;
      goto LAB_0033f4f6;
    }
    goto LAB_0033f518;
  }
  std::__cxx11::string::~string((string *)&notSet);
  std::__cxx11::string::~string((string *)&resultVariable);
LAB_0033f5f5:
  std::__cxx11::string::~string((string *)&testVariable);
  return true;
}

Assistant:

bool cmVariableRequiresCommand
::InitialPass(std::vector<std::string>const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0035,
      "The variable_requires command should not be called; see CMP0035."))
    { return true; }
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string testVariable = args[0];
  if(!this->Makefile->IsOn(testVariable))
    {
    return true;
    }
  std::string resultVariable = args[1];
  bool requirementsMet = true;
  std::string notSet;
  bool hasAdvanced = false;
  cmState* state = this->Makefile->GetState();
  for(unsigned int i = 2; i < args.size(); ++i)
    {
    if(!this->Makefile->IsOn(args[i]))
      {
      requirementsMet = false;
      notSet += args[i];
      notSet += "\n";
      if(state->GetCacheEntryValue(args[i]) &&
          state->GetCacheEntryPropertyAsBool(args[i], "ADVANCED"))
        {
        hasAdvanced = true;
        }
      }
    }
  const char* reqVar = this->Makefile->GetDefinition(resultVariable);
  // if reqVar is unset, then set it to requirementsMet
  // if reqVar is set to true, but requirementsMet is false , then
  // set reqVar to false.
  if(!reqVar || (!requirementsMet && this->Makefile->IsOn(reqVar)))
    {
    this->Makefile->AddDefinition(resultVariable, requirementsMet);
    }

  if(!requirementsMet)
    {
    std::string message = "Variable assertion failed:\n";
    message += testVariable +
      " Requires that the following unset variables are set:\n";
    message += notSet;
    message += "\nPlease set them, or set ";
    message += testVariable + " to false, and re-configure.\n";
    if(hasAdvanced)
      {
      message +=
        "One or more of the required variables is advanced."
        "  To set the variable, you must turn on advanced mode in cmake.";
      }
    cmSystemTools::Error(message.c_str());
    }

  return true;
}